

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

sexp_conflict
sexp_thread_start(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict thread)

{
  sexp psVar1;
  sexp_conflict *ppsVar2;
  sexp_conflict psVar3;
  
  if ((((ulong)thread & 3) == 0) && (thread->tag == 0x24)) {
    (thread->value).flonum_bits[0x60a4] = '\0';
    psVar3 = (sexp_conflict)sexp_cons_op(ctx,0,2,thread,0x23e);
    psVar1 = (ctx->value).type.setters;
    ppsVar2 = (psVar1->value).context.mark_stack[10].start;
    if ((((ulong)ppsVar2 & 3) == 0) && (*(int *)ppsVar2 == 6)) {
      ppsVar2[2] = psVar3;
    }
    else {
      (psVar1->value).context.mark_stack[9].prev = (sexp_mark_stack_ptr_t *)psVar3;
    }
    (((ctx->value).type.setters)->value).context.mark_stack[10].start = (sexp_conflict *)psVar3;
    return thread;
  }
  psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,0x24,thread);
  return psVar3;
}

Assistant:

sexp sexp_thread_start (sexp ctx, sexp self, sexp_sint_t n, sexp thread) {
  sexp cell;
  sexp_assert_type(ctx, sexp_contextp, SEXP_CONTEXT, thread);
  sexp_context_errorp(thread) = 0;
  cell = sexp_cons(ctx, thread, SEXP_NULL);
  if (sexp_pairp(sexp_global(ctx, SEXP_G_THREADS_BACK))) {
    sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = cell;
    sexp_global(ctx, SEXP_G_THREADS_BACK) = cell;
  } else {            /* init queue */
    sexp_global(ctx, SEXP_G_THREADS_BACK) = sexp_global(ctx, SEXP_G_THREADS_FRONT) = cell;
  }
  return thread;
}